

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.cpp
# Opt level: O0

double __thiscall anon_unknown.dwarf_27313::ExprEval::ParseAtom(ExprEval *this,char **expr)

{
  ExprEval *local_58;
  ExprEval *local_50;
  double res;
  char *end_ptr;
  double res_1;
  char **ppcStack_20;
  bool negative;
  char **expr_local;
  ExprEval *this_local;
  
  while (**expr == ' ') {
    *expr = *expr + 1;
  }
  res_1._7_1_ = **expr == '-';
  if ((bool)res_1._7_1_) {
    *expr = *expr + 1;
  }
  if (**expr == '+') {
    *expr = *expr + 1;
  }
  ppcStack_20 = expr;
  expr_local = (char **)this;
  if (**expr == '(') {
    *expr = *expr + 1;
    this->_paren_count = this->_paren_count + 1;
    local_50 = (ExprEval *)ParseSummands(this,expr);
    if (**ppcStack_20 == ')') {
      *ppcStack_20 = *ppcStack_20 + 1;
      this->_paren_count = this->_paren_count + -1;
      if ((res_1._7_1_ & 1) != 0) {
        local_50 = (ExprEval *)((ulong)local_50 ^ 0x8000000000000000);
      }
      this_local = local_50;
    }
    else {
      this->_err = 1;
      this->_err_pos = *ppcStack_20;
      this_local = (ExprEval *)0x0;
    }
  }
  else {
    local_58 = (ExprEval *)strtod(*expr,(char **)&res);
    if ((char *)res == *ppcStack_20) {
      this->_err = 2;
      this->_err_pos = *ppcStack_20;
      this_local = (ExprEval *)0x0;
    }
    else {
      *ppcStack_20 = (char *)res;
      if ((res_1._7_1_ & 1) != 0) {
        local_58 = (ExprEval *)((ulong)local_58 ^ 0x8000000000000000);
      }
      this_local = local_58;
    }
  }
  return (double)this_local;
}

Assistant:

double ParseAtom(const char*& expr) {
            // Skip spaces
            while(*expr == ' ')
                expr++;

            // Handle the sign before parenthesis (or before number)
            bool negative = false;
            if(*expr == '-') {
                negative = true;
                expr++;
            }
            if(*expr == '+') {
                expr++;
            }

            // Check if there is parenthesis
            if(*expr == '(') {
                expr++;
                _paren_count++;
                double res = ParseSummands(expr);
                if(*expr != ')') {
                    // Unmatched opening parenthesis
                    _err = EEE_PARENTHESIS;
                    _err_pos = expr;
                    return 0;
                }
                expr++;
                _paren_count--;
                return negative ? -res : res;
            }

            // It should be a number; convert it to double
            char* end_ptr;
            double res = strtod(expr, &end_ptr);
            if(end_ptr == expr) {
                // Report error
                _err = EEE_WRONG_CHAR;
                _err_pos = expr;
                return 0;
            }
            // Advance the pointer and return the result
            expr = end_ptr;
            return negative ? -res : res;
        }